

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O2

int __thiscall amrex::EBCellFlagFab::getNumCoveredCells(EBCellFlagFab *this,Box *bx_in)

{
  Box *pBVar1;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  Long LVar5;
  iterator iVar6;
  int i;
  long lVar7;
  long lVar8;
  long lVar9;
  Box bx;
  Box BStack_b8;
  NumCells local_9c;
  pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells> local_88;
  Array4<const_amrex::EBCellFlag> local_58;
  
  iVar4 = *(int *)&(this->super_BaseFab<amrex::EBCellFlag>).field_0x44;
  BStack_b8.smallend.vect._0_8_ = *(undefined8 *)(bx_in->smallend).vect;
  uVar3 = *(undefined8 *)((bx_in->smallend).vect + 2);
  BStack_b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx_in->bigend).vect >> 0x20);
  BStack_b8._20_8_ = *(ulong *)((bx_in->bigend).vect + 2);
  BStack_b8.smallend.vect[2] = (int)uVar3;
  BStack_b8.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    if ((BStack_b8.btype.itype >> ((uint)lVar7 & 0x1f) & 1) != 0) {
      piVar2 = BStack_b8.bigend.vect + lVar7;
      *piVar2 = *piVar2 + -1;
    }
  }
  BStack_b8._20_8_ = BStack_b8._20_8_ & 0xffffffff;
  if (iVar4 != 0) {
    if (iVar4 == -1) {
      LVar5 = Box::numPts(&BStack_b8);
      iVar4 = (int)LVar5;
    }
    else {
      iVar6 = std::
              _Rb_tree<amrex::Box,_std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>,_std::_Select1st<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>,_std::less<amrex::Box>,_std::allocator<std::pair<const_amrex::Box,_amrex::EBCellFlagFab::NumCells>_>_>
              ::find(&(this->m_typemap)._M_t,&BStack_b8);
      if ((_Rb_tree_header *)iVar6._M_node == &(this->m_typemap)._M_t._M_impl.super__Rb_tree_header)
      {
        local_58.p = (this->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_58.ncomp = (this->super_BaseFab<amrex::EBCellFlag>).nvar;
        pBVar1 = &(this->super_BaseFab<amrex::EBCellFlag>).domain;
        local_58.begin.z = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        local_58.begin.x = (pBVar1->smallend).vect[0];
        local_58.begin.y = (pBVar1->smallend).vect[1];
        lVar7 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
        lVar8 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
        lVar9 = (long)(this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
        local_58.jstride = (lVar8 - (pBVar1->smallend).vect[0]) + 1;
        local_58.kstride =
             (lVar7 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
             local_58.jstride;
        local_58.nstride = (lVar9 - local_58.begin.z) * local_58.kstride;
        local_58.end._0_8_ = lVar8 + 1U & 0xffffffff | lVar7 << 0x20;
        local_58.end.z = (int)lVar9;
        anon_unknown_27::countCells(&local_9c,&local_58,&BStack_b8);
        local_88.first.bigend.vect[1] = BStack_b8.bigend.vect[1];
        local_88.first.bigend.vect[2] = BStack_b8.bigend.vect[2];
        local_88.first.btype.itype = BStack_b8.btype.itype;
        local_88.first.smallend.vect[0] = BStack_b8.smallend.vect[0];
        local_88.first.smallend.vect[1] = BStack_b8.smallend.vect[1];
        local_88.first.smallend.vect[2] = BStack_b8.smallend.vect[2];
        local_88.first.bigend.vect[0] = BStack_b8.bigend.vect[0];
        local_88.second.nregular = local_9c.nregular;
        local_88.second.nsingle = local_9c.nsingle;
        local_88.second.type = local_9c.type;
        std::
        _Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
        ::_M_insert_unique<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>
                  ((_Rb_tree<amrex::Box,std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>,std::_Select1st<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>,std::less<amrex::Box>,std::allocator<std::pair<amrex::Box_const,amrex::EBCellFlagFab::NumCells>>>
                    *)&this->m_typemap,&local_88);
        iVar4 = local_9c.ncovered;
      }
      else {
        iVar4 = *(int *)&iVar6._M_node[2]._M_parent;
      }
    }
  }
  return iVar4;
}

Assistant:

int
EBCellFlagFab::getNumCoveredCells (const Box& bx_in) const noexcept
{
    FabType thistype = getType();

    const Box& bx = amrex::enclosedCells(bx_in);

    if (thistype == FabType::regular)
    {
        return 0;
    }
    else if (thistype == FabType::covered)
    {
        return static_cast<int>(bx.numPts());
    }
    else
    {
        std::map<Box,NumCells>::iterator it;
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
        it = m_typemap.find(bx);
        if (it != m_typemap.end())
        {
            return it->second.ncovered;
        }
        else
        {
            auto const& flag = this->const_array();
            auto const& t = countCells(flag, bx);

#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_ebcellflagfab_gettype)
#endif
            m_typemap.insert({bx,t});

            return t.ncovered;
        }
    }
}